

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.hpp
# Opt level: O0

void __thiscall peach::interpreter::Interpreter::popIndentation(Interpreter *this)

{
  reference pvVar1;
  element_type *peVar2;
  element_type *this_00;
  shared_ptr<peach::expression::Expression> local_50 [2];
  shared_ptr<peach::expression::Expression> local_30;
  undefined1 local_20 [8];
  ExprShPtr expr;
  Interpreter *this_local;
  
  expr.super___shared_ptr<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  pvVar1 = std::
           stack<peach::interpreter::Interpreter::UnfinishedExpression,_std::deque<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>_>
           ::top(&this->unfinishedExpressions_);
  std::shared_ptr<peach::expression::Expression>::shared_ptr
            ((shared_ptr<peach::expression::Expression> *)local_20,&pvVar1->expression);
  peVar2 = std::
           __shared_ptr_access<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<peach::expression::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_20);
  pvVar1 = std::
           stack<peach::interpreter::Interpreter::UnfinishedExpression,_std::deque<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>_>
           ::top(&this->unfinishedExpressions_);
  std::shared_ptr<peach::expression::Expression>::
  shared_ptr<peach::expression::ExpressionSequence,void>(&local_30,&pvVar1->sequence);
  (*peVar2->_vptr_Expression[1])(peVar2,&local_30);
  std::shared_ptr<peach::expression::Expression>::~shared_ptr(&local_30);
  std::
  stack<peach::interpreter::Interpreter::UnfinishedExpression,_std::deque<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>_>
  ::pop(&this->unfinishedExpressions_);
  pvVar1 = std::
           stack<peach::interpreter::Interpreter::UnfinishedExpression,_std::deque<peach::interpreter::Interpreter::UnfinishedExpression,_std::allocator<peach::interpreter::Interpreter::UnfinishedExpression>_>_>
           ::top(&this->unfinishedExpressions_);
  this_00 = std::
            __shared_ptr_access<peach::expression::ExpressionSequence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<peach::expression::ExpressionSequence,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pvVar1->sequence);
  std::shared_ptr<peach::expression::Expression>::shared_ptr
            (local_50,(shared_ptr<peach::expression::Expression> *)local_20);
  expression::ExpressionSequence::addExpression(this_00,local_50);
  std::shared_ptr<peach::expression::Expression>::~shared_ptr(local_50);
  std::shared_ptr<peach::expression::Expression>::~shared_ptr
            ((shared_ptr<peach::expression::Expression> *)local_20);
  return;
}

Assistant:

void popIndentation()
    {
        auto expr = unfinishedExpressions_.top().expression;
        expr->addExpressionFromNextIndentationLevel(unfinishedExpressions_.top().sequence);
        unfinishedExpressions_.pop();
        unfinishedExpressions_.top().sequence->addExpression(expr);
    }